

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppVerify(Vec_Wrd_t *p,word *pMatrix,int nVars,int nVarsMin)

{
  word *pwVar1;
  bool bVar2;
  word *pwVar3;
  Vec_Wrd_t *p_00;
  word wVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  word Entry;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  
  p_00 = Vec_WrdAlloc(p->nSize);
  iVar8 = 0;
  if (nVars < 1) {
    nVars = 0;
  }
  uVar11 = (ulong)(uint)nVarsMin;
  if (nVarsMin < 1) {
    uVar11 = 0;
  }
  for (; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
    wVar4 = Vec_WrdEntry(p,iVar8);
    Entry = 0;
    for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      bVar2 = false;
      for (uVar6 = 0; (uint)nVars != uVar6; uVar6 = uVar6 + 1) {
        uVar10 = 1L << ((byte)uVar6 & 0x3f);
        bVar2 = (bool)(bVar2 ^ ((uVar10 & wVar4) != 0 && (pMatrix[uVar7] & uVar10) != 0));
      }
      uVar6 = 0;
      if (bVar2) {
        uVar6 = 1L << ((byte)uVar7 & 0x3f);
      }
      Entry = Entry | uVar6;
    }
    Vec_WrdPush(p_00,Entry);
  }
  pwVar1 = p_00->pArray + p_00->nSize;
  iVar8 = 0;
  pwVar3 = p_00->pArray;
  while (pwVar5 = pwVar3, pwVar5 < pwVar1) {
    for (pwVar9 = pwVar5 + 1; pwVar3 = pwVar5 + 1, pwVar9 < pwVar1; pwVar9 = pwVar9 + 1) {
      iVar8 = iVar8 + (uint)(*pwVar5 == *pwVar9);
    }
  }
  if (iVar8 == 0) {
    puts("Verification successful.");
  }
  else {
    printf("The total of %d pairs fail verification.\n");
  }
  Vec_WrdFree(p_00);
  return;
}

Assistant:

void Abc_SuppVerify( Vec_Wrd_t * p, word * pMatrix, int nVars, int nVarsMin )
{
    Vec_Wrd_t * pNew;
    word * pLimit, * pEntry1, * pEntry2;
    word Entry, EntryNew;
    int i, k, v, Value, Counter = 0;
    pNew = Vec_WrdAlloc( Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        EntryNew = 0;
        for ( v = 0; v < nVarsMin; v++ )
        {
            Value = 0;
            for ( k = 0; k < nVars; k++ )
                if ( ((pMatrix[v] >> k) & 1) && ((Entry >> k) & 1) )
                    Value ^= 1;
            if ( Value )
                EntryNew |= (((word)1) << v);            
        }
        Vec_WrdPush( pNew, EntryNew );
    }
    // check that they are disjoint
    pLimit  = Vec_WrdLimit(pNew);
    pEntry1 = Vec_WrdArray(pNew);
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
        if ( *pEntry1 == *pEntry2 )
            Counter++;
    if ( Counter )
        printf( "The total of %d pairs fail verification.\n", Counter );
    else
        printf( "Verification successful.\n" );
    Vec_WrdFree( pNew );
}